

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair_mat.h
# Opt level: O0

void make_pair_matrix(void)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int j;
  int i;
  char c;
  int local_8;
  int local_4;
  
  if (energy_set == 0) {
    for (local_4 = 0; local_4 < 5; local_4 = local_4 + 1) {
      alias[local_4] = (short)local_4;
    }
    alias[5] = 3;
    alias[6] = 2;
    alias[7] = 0;
    for (local_4 = 0; local_4 < 8; local_4 = local_4 + 1) {
      for (local_8 = 0; local_8 < 8; local_8 = local_8 + 1) {
        pair[local_4][local_8] = BP_pair[local_4][local_8];
      }
    }
    if (noGU != 0) {
      pair[4][3] = 0;
      pair[3][4] = 0;
    }
    if (nonstandards != (char *)0x0) {
      for (local_4 = 0; sVar3 = strlen(nonstandards), local_4 < (int)sVar3; local_4 = local_4 + 2) {
        c = (char)((uint)local_4 >> 0x18);
        iVar1 = encode_char(c);
        iVar2 = encode_char(c);
        pair[iVar1][iVar2] = 7;
      }
    }
    for (local_4 = 0; local_4 < 8; local_4 = local_4 + 1) {
      for (local_8 = 0; local_8 < 8; local_8 = local_8 + 1) {
        rtype[pair[local_4][local_8]] = pair[local_8][local_4];
      }
    }
  }
  else {
    for (local_4 = 0; local_4 < 0x15; local_4 = local_4 + 1) {
      for (local_8 = 0; local_8 < 0x15; local_8 = local_8 + 1) {
        pair[local_4][local_8] = 0;
      }
    }
    if (energy_set == 1) {
      local_4 = 1;
      while (local_4 < 0x14) {
        iVar1 = local_4 + 1;
        alias[local_4] = 3;
        local_4 = local_4 + 2;
        alias[iVar1] = 2;
      }
      for (local_4 = 1; local_4 < 0x14; local_4 = local_4 + 2) {
        pair[local_4][local_4 + 1] = 2;
        pair[local_4 + 1][local_4] = 1;
      }
    }
    else if (energy_set == 2) {
      local_4 = 1;
      while (local_4 < 0x14) {
        iVar1 = local_4 + 1;
        alias[local_4] = 1;
        local_4 = local_4 + 2;
        alias[iVar1] = 4;
      }
      for (local_4 = 1; local_4 < 0x14; local_4 = local_4 + 2) {
        pair[local_4][local_4 + 1] = 5;
        pair[local_4 + 1][local_4] = 6;
      }
    }
    else if (energy_set == 3) {
      local_4 = 1;
      while (local_4 < 0x12) {
        alias[local_4] = 3;
        alias[local_4 + 1] = 2;
        iVar1 = local_4 + 3;
        alias[local_4 + 2] = 1;
        local_4 = local_4 + 4;
        alias[iVar1] = 4;
      }
      for (local_4 = 1; local_4 < 0x12; local_4 = local_4 + 4) {
        pair[local_4][local_4 + 1] = 2;
        pair[local_4 + 1][local_4] = 1;
        pair[local_4 + 2][local_4 + 3] = 5;
        pair[local_4 + 3][local_4 + 2] = 6;
      }
    }
    else {
      vrna_message_error("What energy_set are YOU using??");
    }
    for (local_4 = 0; local_4 < 0x15; local_4 = local_4 + 1) {
      for (local_8 = 0; local_8 < 0x15; local_8 = local_8 + 1) {
        rtype[pair[local_4][local_8]] = pair[local_8][local_4];
      }
    }
  }
  return;
}

Assistant:

static INLINE void
make_pair_matrix(void)
{
  int i, j;

  if (energy_set == 0) {
    for (i = 0; i < 5; i++)
      alias[i] = (short)i;
    alias[5]  = 3;  /* X <-> G */
    alias[6]  = 2;  /* K <-> C */
    alias[7]  = 0;  /* I <-> default base '@' */
    for (i = 0; i < NBASES; i++)
      for (j = 0; j < NBASES; j++)
        pair[i][j] = BP_pair[i][j];
    if (noGU)
      pair[3][4] = pair[4][3] = 0;

    if (nonstandards != NULL) {
      /* allow nonstandard bp's */
      for (i = 0; i < (int)strlen(nonstandards); i += 2)
        pair[encode_char(nonstandards[i])]
        [encode_char(nonstandards[i + 1])] = 7;
    }

    for (i = 0; i < NBASES; i++)
      for (j = 0; j < NBASES; j++)
        rtype[pair[i][j]] = pair[j][i];
  } else {
    for (i = 0; i <= MAXALPHA; i++)
      for (j = 0; j <= MAXALPHA; j++)
        pair[i][j] = 0;
    if (energy_set == 1) {
      for (i = 1; i < MAXALPHA; ) {
        alias[i++]  = 3;      /* A <-> G */
        alias[i++]  = 2;      /* B <-> C */
      }
      for (i = 1; i < MAXALPHA; i++) {
        pair[i][i + 1] = 2;       /* AB <-> GC */
        i++;
        pair[i][i - 1] = 1;       /* BA <-> CG */
      }
    } else if (energy_set == 2) {
      for (i = 1; i < MAXALPHA; ) {
        alias[i++]  = 1;      /* A <-> A*/
        alias[i++]  = 4;      /* B <-> U */
      }
      for (i = 1; i < MAXALPHA; i++) {
        pair[i][i + 1] = 5;       /* AB <-> AU */
        i++;
        pair[i][i - 1] = 6;       /* BA <-> UA */
      }
    } else if (energy_set == 3) {
      for (i = 1; i < MAXALPHA - 2; ) {
        alias[i++]  = 3;    /* A <-> G */
        alias[i++]  = 2;    /* B <-> C */
        alias[i++]  = 1;    /* C <-> A */
        alias[i++]  = 4;    /* D <-> U */
      }
      for (i = 1; i < MAXALPHA - 2; i++) {
        pair[i][i + 1] = 2;     /* AB <-> GC */
        i++;
        pair[i][i - 1] = 1;     /* BA <-> CG */
        i++;
        pair[i][i + 1] = 5;     /* CD <-> AU */
        i++;
        pair[i][i - 1] = 6;     /* DC <-> UA */
      }
    } else {
      vrna_message_error("What energy_set are YOU using??");
    }

    for (i = 0; i <= MAXALPHA; i++)
      for (j = 0; j <= MAXALPHA; j++)
        rtype[pair[i][j]] = pair[j][i];
  }
}